

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

CppTypeName * __thiscall
capnp::anon_unknown_1::CppTypeName::makePrimitive
          (CppTypeName *__return_storage_ptr__,CppTypeName *this,StringPtr name)

{
  StringTree local_58;
  CppTypeName *local_20;
  StringPtr name_local;
  
  name_local.content.ptr = name.content.ptr;
  local_20 = this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  kj::strTree<kj::StringPtr&>(&local_58,(kj *)&local_20,(StringPtr *)name_local.content.ptr);
  CppTypeName(__return_storage_ptr__,&local_58,false);
  kj::StringTree::~StringTree(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static CppTypeName makePrimitive(kj::StringPtr name) {
    return CppTypeName(kj::strTree(name), false);
  }